

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O0

void __thiscall Graph::read_binary(Graph *this,string *_attribute_file,string *_graph_file)

{
  value_type vVar1;
  value_type vVar2;
  VertexIdType VVar3;
  uint uVar4;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last_00;
  byte bVar5;
  bool bVar6;
  unsigned_long uVar7;
  ostream *poVar8;
  char *__filename;
  Edge *__ptr;
  size_type sVar9;
  reference pvVar10;
  uint *puVar11;
  undefined8 uVar12;
  string *in_RDX;
  string *in_RSI;
  uint *in_RDI;
  double time_end;
  VertexIdType *id;
  iterator __end1_3;
  iterator __begin1_3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1_3;
  VertexIdType *in_position;
  VertexIdType *pos;
  VertexIdType *to_id_2;
  pair<unsigned_int,_unsigned_int> *pair;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range1_2;
  uint32_t in_pos_pair;
  double time_sort_end;
  double time_sort_start;
  vector<unsigned_int,_std::allocator<unsigned_int>_> in_positions_to_fill;
  VertexIdType *out_position;
  VertexIdType *to_id_1;
  VertexIdType *from_id_1;
  Edge *edge_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Edge,_std::allocator<Edge>_> *__range1_1;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  position_pair;
  uint32_t msg_gap;
  uint32_t edges_processed;
  vector<unsigned_int,_std::allocator<unsigned_int>_> out_positions_to_fill;
  VertexIdType next_id;
  VertexIdType current_id;
  VertexIdType j;
  VertexIdType i_1;
  VertexIdType i;
  uint32_t degree_max;
  VertexIdType *to_id;
  VertexIdType *from_id;
  Edge *edge;
  iterator __end1;
  iterator __begin1;
  vector<Edge,_std::allocator<Edge>_> *__range1;
  double end;
  size_t rtn;
  FILE *f;
  vector<Edge,_std::allocator<Edge>_> edges;
  double start;
  size_t start2;
  size_t start1;
  ifstream attribute_file;
  string line;
  vector<Edge,_std::allocator<Edge>_> *in_stack_fffffffffffff958;
  string *in_stack_fffffffffffff960;
  allocator *paVar13;
  uint *in_stack_fffffffffffff968;
  allocator_type *in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff97c;
  uint uVar14;
  vector<Edge,_std::allocator<Edge>_> *in_stack_fffffffffffff980;
  allocator_type *in_stack_fffffffffffff988;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff998;
  undefined4 in_stack_fffffffffffff99c;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffff9a0;
  allocator local_501;
  string local_500 [32];
  double local_4e0;
  reference local_4d8;
  uint *local_4d0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_4c8;
  uint *local_4c0;
  reference local_4b8;
  uint *local_4b0;
  reference local_4a8;
  reference local_4a0;
  pair<unsigned_int,_unsigned_int> *local_498;
  __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_490;
  undefined1 *local_488;
  uint local_47c;
  undefined4 local_478;
  allocator local_471;
  string local_470 [32];
  double local_450;
  pair<unsigned_int,_unsigned_int> *local_440;
  pair<unsigned_int,_unsigned_int> *local_438;
  double local_430;
  uint *local_420;
  uint *local_418;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_410;
  allocator local_3f1;
  string local_3f0 [32];
  reference local_3d0;
  VertexIdType *local_3c8;
  reference local_3c0;
  reference local_3b8;
  Edge *local_3b0;
  __normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_> local_3a8;
  vector<Edge,_std::allocator<Edge>_> *local_3a0;
  undefined1 local_398 [24];
  uint local_380 [3];
  uint local_374;
  undefined4 local_370;
  uint *local_368;
  uint *local_360;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_358;
  uint local_33c;
  uint local_338;
  uint local_334;
  undefined4 local_330;
  uint local_32c;
  uint local_328;
  undefined4 local_324;
  uint local_320;
  uint local_31c;
  VertexIdType *local_318;
  reference local_310;
  reference local_308;
  Edge *local_300;
  __normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_> local_2f8;
  vector<Edge,_std::allocator<Edge>_> *local_2f0;
  undefined4 local_2e8;
  undefined4 local_2e4;
  double local_2e0;
  size_t local_2d8;
  FILE *local_2d0;
  vector<Edge,_std::allocator<Edge>_> local_2c0;
  double local_2a8;
  string local_2a0 [32];
  undefined8 local_280;
  string local_278 [32];
  undefined8 local_258;
  istream local_240 [520];
  string local_38 [32];
  string *local_18;
  string *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_38);
  std::ifstream::ifstream(local_240,local_10,8);
  bVar5 = std::ifstream::is_open();
  if ((bVar5 & 1) == 0) {
    printf("/workspace/llm4binary/github/license_c_cmakelists/wuhao-wu-jiang[P]Personalized-PageRank/Graph.h; LINE %d; File Not Exists.\n"
           ,0xa1);
    poVar8 = std::operator<<((ostream *)&std::cout,local_10);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  std::getline<char,std::char_traits<char>,std::allocator<char>>(local_240,local_38);
  local_258 = std::__cxx11::string::find_first_of((char)local_38,0x3d);
  std::__cxx11::string::substr((ulong)local_278,(ulong)local_38);
  uVar7 = std::__cxx11::stoul(in_stack_fffffffffffff960,(size_t *)in_stack_fffffffffffff958,0);
  *in_RDI = (uint)uVar7;
  std::__cxx11::string::~string(local_278);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(local_240,local_38);
  local_280 = std::__cxx11::string::find_first_of((char)local_38,0x3d);
  std::__cxx11::string::substr((ulong)local_2a0,(ulong)local_38);
  uVar7 = std::__cxx11::stoul(in_stack_fffffffffffff960,(size_t *)in_stack_fffffffffffff958,0);
  in_RDI[1] = (uint)uVar7;
  std::__cxx11::string::~string(local_2a0);
  in_RDI[4] = *in_RDI;
  printf("The Number of Vertices: %d\n",(ulong)*in_RDI);
  printf("The Number of Edges: %d\n",(ulong)in_RDI[1]);
  std::ifstream::close();
  std::ifstream::~ifstream(local_240);
  std::__cxx11::string::~string(local_38);
  local_2a8 = getCurrentTime();
  std::allocator<Edge>::allocator((allocator<Edge> *)0x109a68);
  std::vector<Edge,_std::allocator<Edge>_>::vector
            (in_stack_fffffffffffff980,CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978)
             ,in_stack_fffffffffffff970);
  std::allocator<Edge>::~allocator((allocator<Edge> *)0x109a94);
  __filename = (char *)std::__cxx11::string::c_str();
  local_2d0 = fopen(__filename,"rb");
  if (local_2d0 == (FILE *)0x0) {
    printf("Graph::read; File Not Exists.\n");
    poVar8 = std::operator<<((ostream *)&std::cout,local_18);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  __ptr = std::vector<Edge,_std::allocator<Edge>_>::data
                    ((vector<Edge,_std::allocator<Edge>_> *)0x109aee);
  sVar9 = std::vector<Edge,_std::allocator<Edge>_>::size(&local_2c0);
  local_2d8 = fread(__ptr,8,sVar9,local_2d0);
  printf("Returned Value of fread: %zu\n",local_2d8);
  fclose(local_2d0);
  local_2e0 = getCurrentTime();
  printf("Time Used For Loading BINARY : %.2f\n",local_2e0 - local_2a8);
  in_RDI[1] = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x109c7a);
  local_2e4 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff990,
             (size_type)in_stack_fffffffffffff988,(value_type_conflict *)in_stack_fffffffffffff980);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x109cc4);
  local_2e8 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff990,
             (size_type)in_stack_fffffffffffff988,(value_type_conflict *)in_stack_fffffffffffff980);
  local_2f0 = &local_2c0;
  local_2f8._M_current =
       (Edge *)std::vector<Edge,_std::allocator<Edge>_>::begin(in_stack_fffffffffffff958);
  local_300 = (Edge *)std::vector<Edge,_std::allocator<Edge>_>::end(in_stack_fffffffffffff958);
  while (bVar6 = __gnu_cxx::operator!=
                           ((__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_> *)
                            in_stack_fffffffffffff960,
                            (__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_> *)
                            in_stack_fffffffffffff958), bVar6) {
    local_310 = __gnu_cxx::__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>::
                operator*(&local_2f8);
    local_318 = &local_310->to_id;
    local_308 = local_310;
    if (local_310->from_id != *local_318) {
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 10),
                           (ulong)local_310->from_id);
      *pvVar10 = *pvVar10 + 1;
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),
                           (ulong)*local_318);
      *pvVar10 = *pvVar10 + 1;
      in_RDI[1] = in_RDI[1] + 1;
    }
    __gnu_cxx::__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>::operator++
              (&local_2f8);
  }
  local_31c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x109e2b);
  for (local_320 = 0; local_320 < *in_RDI; local_320 = local_320 + 1) {
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 10),
                         (ulong)local_320);
    if (*pvVar10 == 0) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff970,
                 in_stack_fffffffffffff968);
    }
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 10),
                         (ulong)local_320);
    puVar11 = std::max<unsigned_int>(&local_31c,pvVar10);
    local_31c = *puVar11;
  }
  sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x2e));
  in_RDI[2] = (uint)sVar9;
  printf("The number of dead end vertices:%d\n",(ulong)in_RDI[2]);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x109f35);
  local_324 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff990,
             (size_type)in_stack_fffffffffffff988,(value_type_conflict *)in_stack_fffffffffffff980);
  local_328 = 0;
  for (local_32c = 1; local_32c < *in_RDI; local_32c = local_32c + 1) {
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1c),
                         (ulong)local_328);
    vVar1 = *pvVar10;
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),
                         (ulong)local_328);
    vVar2 = *pvVar10;
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1c),
                         (ulong)local_32c);
    *pvVar10 = vVar1 + vVar2;
    local_328 = local_328 + 1;
  }
  uVar14 = in_RDI[1];
  pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1c),
                       (ulong)*in_RDI);
  *pvVar10 = uVar14;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x10a06e);
  local_330 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff990,
             (size_type)in_stack_fffffffffffff988,(value_type_conflict *)in_stack_fffffffffffff980);
  local_334 = 0;
  for (local_338 = 1; local_338 < *in_RDI + 1; local_338 = local_338 + 1) {
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x16),
                         (ulong)local_334);
    vVar1 = *pvVar10;
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 10),
                         (ulong)local_334);
    local_33c = 1;
    puVar11 = std::max<unsigned_int>(pvVar10,&local_33c);
    uVar14 = *puVar11;
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x16),
                         (ulong)local_338);
    *pvVar10 = vVar1 + uVar14;
    local_334 = local_334 + 1;
  }
  pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 10),
                       (ulong)in_RDI[4]);
  *pvVar10 = 0;
  pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x16),
                       (ulong)*in_RDI);
  vVar1 = *pvVar10;
  pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x16),
                       (ulong)(*in_RDI + 1));
  *pvVar10 = vVar1;
  local_360 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 in_stack_fffffffffffff958);
  local_368 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 in_stack_fffffffffffff958);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x10a246);
  __last._M_current._4_4_ = in_stack_fffffffffffff99c;
  __last._M_current._0_4_ = in_stack_fffffffffffff998;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff990,
             in_stack_fffffffffffff9a0,__last,in_stack_fffffffffffff988);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x10a27a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x10a296);
  local_370 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff990,
             (size_type)in_stack_fffffffffffff988,(value_type_conflict *)in_stack_fffffffffffff980);
  local_374 = 0;
  local_380[1] = 1;
  local_380[0] = in_RDI[1] / 10;
  puVar11 = std::max<unsigned_int>(local_380 + 1,local_380);
  local_380[2] = *puVar11;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)0x10a34d);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::reserve(in_stack_fffffffffffff990,(size_type)in_stack_fffffffffffff988);
  local_3a0 = &local_2c0;
  local_3a8._M_current =
       (Edge *)std::vector<Edge,_std::allocator<Edge>_>::begin(in_stack_fffffffffffff958);
  local_3b0 = (Edge *)std::vector<Edge,_std::allocator<Edge>_>::end(in_stack_fffffffffffff958);
  while (bVar6 = __gnu_cxx::operator!=
                           ((__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_> *)
                            in_stack_fffffffffffff960,
                            (__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_> *)
                            in_stack_fffffffffffff958), bVar6) {
    local_3c0 = __gnu_cxx::__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>::
                operator*(&local_3a8);
    local_3c8 = &local_3c0->to_id;
    local_3b8 = local_3c0;
    if (local_3c0->from_id != *local_3c8) {
      local_3d0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&local_358,(ulong)local_3c0->from_id);
      VVar3 = *local_3c8;
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x22),
                           (ulong)*local_3d0);
      *pvVar10 = VVar3;
      std::
      vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
      ::emplace_back<unsigned_int_const&,unsigned_int&>
                ((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  *)in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                 (uint *)in_stack_fffffffffffff960);
      *local_3d0 = *local_3d0 + 1;
      local_374 = local_374 + 1;
      if (local_374 % local_380[2] == 0) {
        printf("%u edges processed.\n",(ulong)local_374);
      }
    }
    __gnu_cxx::__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>::operator++
              (&local_3a8);
  }
  std::vector<Edge,_std::allocator<Edge>_>::clear((vector<Edge,_std::allocator<Edge>_> *)0x10a550);
  poVar8 = std::operator<<((ostream *)&std::cout,"edges_processed");
  poVar8 = std::operator<<(poVar8,":");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_374);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f0,0x1e,'-',&local_3f1);
  uVar12 = std::__cxx11::string::c_str();
  printf("%s\n",uVar12);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  local_418 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 in_stack_fffffffffffff958);
  local_420 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 in_stack_fffffffffffff958);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x10a674);
  __last_00._M_current._4_4_ = in_stack_fffffffffffff99c;
  __last_00._M_current._0_4_ = in_stack_fffffffffffff998;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff990,
             in_stack_fffffffffffff9a0,__last_00,in_stack_fffffffffffff988);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x10a6a8);
  uVar14 = in_RDI[1];
  pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      (&local_410,(ulong)*in_RDI);
  *pvVar10 = uVar14;
  local_430 = getCurrentTime();
  local_438 = (pair<unsigned_int,_unsigned_int> *)
              std::
              vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ::begin((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)in_stack_fffffffffffff958);
  local_440 = (pair<unsigned_int,_unsigned_int> *)
              std::
              vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ::end((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)in_stack_fffffffffffff958);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_int>*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>,std::less<void>>
            (local_438,local_440);
  local_450 = getCurrentTime();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_470,0x1e,'-',&local_471);
  uVar12 = std::__cxx11::string::c_str();
  printf("%s\n",uVar12);
  std::__cxx11::string::~string(local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x10a7cc);
  local_478 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff990,
             (size_type)in_stack_fffffffffffff988,(value_type_conflict *)in_stack_fffffffffffff980);
  local_47c = 0;
  local_488 = local_398;
  local_490._M_current =
       (pair<unsigned_int,_unsigned_int> *)
       std::
       vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
       ::begin((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                *)in_stack_fffffffffffff958);
  local_498 = (pair<unsigned_int,_unsigned_int> *)
              std::
              vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ::end((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)in_stack_fffffffffffff958);
  while (bVar6 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                             *)in_stack_fffffffffffff960,
                            (__normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                             *)in_stack_fffffffffffff958), bVar6) {
    local_4a8 = __gnu_cxx::
                __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                ::operator*(&local_490);
    local_4b0 = &local_4a8->second;
    local_4a0 = local_4a8;
    local_4b8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&local_410,(ulong)local_4a8->first);
    uVar14 = *local_4b0;
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x28),
                         (ulong)*local_4b8);
    *pvVar10 = uVar14;
    *local_4b8 = *local_4b8 + 1;
    local_47c = local_47c + 1;
    if (local_47c % local_380[2] == 0) {
      poVar8 = std::operator<<((ostream *)&std::cout,"in_pos_pair");
      poVar8 = std::operator<<(poVar8,":");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_47c);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
    ::operator++(&local_490);
  }
  local_4c0 = in_RDI + 0x2e;
  local_4c8._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          in_stack_fffffffffffff958);
  local_4d0 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 in_stack_fffffffffffff958);
  while (bVar6 = __gnu_cxx::operator!=
                           ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)in_stack_fffffffffffff960,
                            (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)in_stack_fffffffffffff958), bVar6) {
    local_4d8 = __gnu_cxx::
                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator*(&local_4c8);
    uVar14 = in_RDI[4];
    in_stack_fffffffffffff970 = (allocator_type *)(in_RDI + 0x22);
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&local_358,(ulong)*local_4d8);
    uVar4 = *pvVar10;
    *pvVar10 = uVar4 + 1;
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         in_stack_fffffffffffff970,(ulong)uVar4);
    *pvVar10 = uVar14;
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&local_4c8);
  }
  local_4e0 = getCurrentTime();
  printf("Graph Build Finished. TIME: %.4f\n",local_4e0 - local_2a8);
  paVar13 = &local_501;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_500,0x6e,'-',paVar13);
  uVar12 = std::__cxx11::string::c_str();
  printf("%s\n",uVar12);
  std::__cxx11::string::~string(local_500);
  std::allocator<char>::~allocator((allocator<char> *)&local_501);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff970);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)in_stack_fffffffffffff970);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff970);
  std::vector<Edge,_std::allocator<Edge>_>::~vector
            ((vector<Edge,_std::allocator<Edge>_> *)in_stack_fffffffffffff970);
  return;
}

Assistant:

void read_binary(const std::string &_attribute_file,
                     const std::string &_graph_file) {
        {
            std::string line;
            std::ifstream attribute_file(_attribute_file);
            if (attribute_file.is_open()) {
                std::getline(attribute_file, line);
                size_t start1 = line.find_first_of('=');
                numOfVertices = std::stoul(line.substr(start1 + 1));
                std::getline(attribute_file, line);
                size_t start2 = line.find_first_of('=');
                numOfEdges = std::stoul(line.substr(start2 + 1));
                dummy_id = numOfVertices;
                printf("The Number of Vertices: %d\n", numOfVertices);
                printf("The Number of Edges: %d\n", numOfEdges);
                attribute_file.close();
            } else {
                printf(__FILE__ "; LINE %d; File Not Exists.\n", __LINE__);
                std::cout << _attribute_file << std::endl;
                exit(1);
            }
        }
        const auto start = getCurrentTime();
        // create temporary graph
        std::vector<Edge> edges(numOfEdges);
        if (std::FILE *f = std::fopen(_graph_file.c_str(), "rb")) {
            size_t rtn = std::fread(edges.data(), sizeof edges[0], edges.size(), f);
            printf("Returned Value of fread: %zu\n", rtn);
            std::fclose(f);
        } else {
            printf("Graph::read; File Not Exists.\n");
            std::cout << _graph_file << std::endl;
            exit(1);
        }
        const auto end = getCurrentTime();
        printf("Time Used For Loading BINARY : %.2f\n", end - start);

        // read the edges
        // the ids must be in the range from [0 .... the number of vertices - 1];
        numOfEdges = 0;
        out_degrees.clear();
        out_degrees.resize(numOfVertices + 2, 0);
        in_degrees.clear();
        in_degrees.resize(numOfVertices + 2, 0);
        for (auto &edge : edges) {
            const VertexIdType &from_id = edge.from_id;
            const VertexIdType &to_id = edge.to_id;
            // remove self loop
            if (from_id != to_id) {
                //the edge read is a directed one
                ++out_degrees[from_id];
                ++in_degrees[to_id];
                ++numOfEdges;
            }
        }
        /* final count */
//        printf("%d-th Directed Edge Processed.\n", numOfEdges);

        // sort the adj list
//        for (auto &neighbors : matrix) {
//            std::sort(neighbors.begin(), neighbors.end());
//        }

        // process the dead_end
        uint32_t degree_max = 0;
        deadend_vertices.clear();
        for (VertexIdType i = 0; i < numOfVertices; ++i) {
            if (out_degrees[i] == 0) {
                deadend_vertices.emplace_back(i);
            }
            degree_max = std::max(degree_max, out_degrees[i]);
        }
        num_deadend_vertices = deadend_vertices.size();
        printf("The number of dead end vertices:%d\n", num_deadend_vertices);

        // process pos_list list
        start_pos_in_appearance_pos_lists.clear();
        start_pos_in_appearance_pos_lists.resize(numOfVertices + 2, 0);
        for (VertexIdType i = 0, j = 1; j < numOfVertices; ++i, ++j) {
            start_pos_in_appearance_pos_lists[j] = start_pos_in_appearance_pos_lists[i] + in_degrees[i];
        }
        start_pos_in_appearance_pos_lists[numOfVertices] = numOfEdges;

        // process out list
        start_pos_in_out_neighbor_lists.clear();
        start_pos_in_out_neighbor_lists.resize(numOfVertices + 2, 0);
        for (VertexIdType current_id = 0, next_id = 1; next_id < numOfVertices + 1; ++current_id, ++next_id) {
            start_pos_in_out_neighbor_lists[next_id] =
                    start_pos_in_out_neighbor_lists[current_id] + std::max(out_degrees[current_id], 1u);
        }
        // process dummy vertex
        assert(start_pos_in_out_neighbor_lists[numOfVertices] == numOfEdges + deadend_vertices.size());
        out_degrees[dummy_id] = 0;
        start_pos_in_out_neighbor_lists[numOfVertices + 1] = start_pos_in_out_neighbor_lists[numOfVertices];
        ////////////////////////////////////////////////////////////

        // compute the positions
        std::vector<VertexIdType> out_positions_to_fill(start_pos_in_out_neighbor_lists.begin(),
                                                        start_pos_in_out_neighbor_lists.end());
        // fill the edge list
        out_neighbors_lists.clear();
        out_neighbors_lists.resize(numOfEdges + num_deadend_vertices + degree_max, 0);
        uint32_t edges_processed = 0;
        uint32_t msg_gap = std::max(1u, numOfEdges / 10);
        std::vector<std::pair<VertexIdType, VertexIdType>> position_pair;
        position_pair.reserve(numOfEdges);
        for (auto &edge : edges) {
            const VertexIdType &from_id = edge.from_id;
            const VertexIdType &to_id = edge.to_id;
            // remove self loop
            if (from_id != to_id) {
                VertexIdType &out_position = out_positions_to_fill[from_id];
                assert(out_position < out_positions_to_fill[from_id + 1]);
                out_neighbors_lists[out_position] = to_id;
                position_pair.emplace_back(to_id, out_position);
                ++out_position;
                if (++edges_processed % msg_gap == 0) {
                    printf("%u edges processed.\n", edges_processed);
                }
            }
        }
        edges.clear();
        MSG(edges_processed);
        printf("%s\n", std::string(30, '-').c_str());
#ifdef USE_REVERSE_POS
        std::vector<VertexIdType> in_positions_to_fill(start_pos_in_appearance_pos_lists.begin(),
                                                       start_pos_in_appearance_pos_lists.end());
        in_positions_to_fill[numOfVertices] = numOfEdges;
        const double time_sort_start = getCurrentTime();
        std::sort(position_pair.begin(), position_pair.end(), std::less<>());
        const double time_sort_end = getCurrentTime();
//        MSG(time_sort_end - time_sort_start);
        printf("%s\n", std::string(30, '-').c_str());
        appearance_pos_lists.clear();
        appearance_pos_lists.resize(numOfEdges + num_deadend_vertices + degree_max, 0);
        uint32_t in_pos_pair = 0;
        for (const auto &pair : position_pair) {
            const VertexIdType &to_id = pair.first;
            const VertexIdType &pos = pair.second;
            VertexIdType &in_position = in_positions_to_fill[to_id];
            assert(in_position < in_positions_to_fill[to_id + 1]);
            appearance_pos_lists[in_position] = pos;
            ++in_position;
            if (++in_pos_pair % msg_gap == 0) {
                MSG(in_pos_pair);
            }
        }
#endif

        // fill the dummy ids
        for (const VertexIdType &id : deadend_vertices) {
            out_neighbors_lists[out_positions_to_fill[id]++] = dummy_id;
        }

#ifdef DEBUG_MODE
//        show();
        // sanity check
//        std::memcpy(in_positions_to_fill.data(), start_pos_in_appearance_pos_lists.data(),
//                    sizeof(VertexIdType) * numOfVertices);
//        for (uint32_t index = 0; index < numOfEdges + num_deadend_vertices; ++index) {
//            const VertexIdType id = out_neighbors_lists[index];
//            if (id != numOfVertices) {
//                VertexIdType &in_position = in_positions_to_fill[id];
//                if (appearance_pos_lists[in_position] != index) {
//                    printf("Error in " __FILE__  ", line %d, in position error.\n", __LINE__);
//                    MSG(index);
//                    MSG(id);
//                    MSG(in_position);
//                    exit(1);
//                }
//                ++in_position;
//            }
//        }
#endif
        const double time_end = getCurrentTime();
        printf("Graph Build Finished. TIME: %.4f\n", time_end - start);
        printf("%s\n", std::string(110, '-').c_str());

    }